

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

uint16_t unorm_getFCD16_63(UChar32 c)

{
  UBool UVar1;
  Normalizer2Impl *this;
  Normalizer2Impl *impl;
  UChar32 local_10;
  UErrorCode errorCode;
  UChar32 c_local;
  
  impl._4_4_ = U_ZERO_ERROR;
  local_10 = c;
  this = icu_63::Normalizer2Factory::getNFCImpl((UErrorCode *)((long)&impl + 4));
  UVar1 = U_SUCCESS(impl._4_4_);
  if (UVar1 == '\0') {
    errorCode._2_2_ = U_ZERO_ERROR >> 0x10;
  }
  else {
    errorCode._2_2_ = icu_63::Normalizer2Impl::getFCD16(this,local_10);
  }
  return errorCode._2_2_;
}

Assistant:

U_CFUNC uint16_t
unorm_getFCD16(UChar32 c) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
    if(U_SUCCESS(errorCode)) {
        return impl->getFCD16(c);
    } else {
        return 0;
    }
}